

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
findAllTags(vector<int,_std::allocator<int>_> *__return_storage_ptr__,ImportedUgrid *mesh)

{
  _Rb_tree_header *__last;
  pointer piVar1;
  int *piVar2;
  vector<int,std::allocator<int>> *pvVar3;
  pointer piVar4;
  int *piVar5;
  int t;
  set<int,_std::less<int>,_std::allocator<int>_> tags;
  int local_6c;
  vector<int,std::allocator<int>> *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  __last = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar4 = (mesh->triangleTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (mesh->triangleTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  if (piVar4 != piVar1) {
    do {
      local_6c = *piVar4;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_6c);
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar1);
  }
  piVar5 = (mesh->quadTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (mesh->quadTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar2) {
    do {
      local_6c = *piVar5;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_6c);
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar2);
  }
  pvVar3 = local_68;
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            (local_68,(_Rb_tree_const_iterator<int>)
                      local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<int>)__last,(allocator_type *)&local_6c);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return (vector<int,_std::allocator<int>_> *)pvVar3;
}

Assistant:

std::vector<int> findAllTags(const Parfait::ImportedUgrid& mesh){
    std::set<int> tags;
    for(auto t : mesh.triangleTags)
        tags.insert(t);
    for(auto t : mesh.quadTags)
        tags.insert(t);
    return {tags.begin(), tags.end()};
}